

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alteration_notifier.h
# Opt level: O3

void __thiscall
lemon::
AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::
detach(AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
       *this,ObserverBase *observer)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
  p_Var2 = (observer->_index)._M_node;
  psVar1 = &(this->_observers).
            super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var2,0x18);
  (observer->_index)._M_node = (_List_node_base *)&this->_observers;
  observer->_notifier = (Notifier *)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
  return;
}

Assistant:

void detach(ObserverBase& observer) {
    _lock.lock();
    _observers.erase(observer._index);
    observer._index    = _observers.end();
    observer._notifier = 0;
    _lock.unlock();
  }